

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O1

PackageId __thiscall chatra::RuntimeImp::loadPackage(RuntimeImp *this,string *packageName)

{
  __atomic_flag_data_type _Var1;
  element_type *peVar2;
  int iVar3;
  iterator iVar4;
  undefined8 *puVar5;
  _Head_base<0UL,_chatra::Package_*,_false> unaff_R13;
  undefined1 local_80 [8];
  PackageInfo p;
  unique_ptr<chatra::Package,_std::default_delete<chatra::Package>_> package;
  PackageId packageId;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->mtLoadPackage);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  do {
    LOCK();
    _Var1 = (this->lockPackages).flag.super___atomic_flag_base._M_i;
    (this->lockPackages).flag.super___atomic_flag_base._M_i = true;
    UNLOCK();
  } while (_Var1 != false);
  iVar4 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chatra::PackageId>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chatra::PackageId>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->packageIdByName)._M_h,packageName);
  if (iVar4.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chatra::PackageId>,_true>
      ._M_cur != (__node_type *)0x0) {
    unaff_R13._M_head_impl =
         *(Package **)
          ((long)iVar4.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chatra::PackageId>,_true>
                 ._M_cur + 0x28);
  }
  (this->lockPackages).flag.super___atomic_flag_base._M_i = false;
  if (iVar4.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chatra::PackageId>,_true>
      ._M_cur == (__node_type *)0x0) {
    peVar2 = (this->host).super___shared_ptr<chatra::IHost,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar2->_vptr_IHost[3])(local_80,peVar2,packageName);
    if (local_80 ==
        (undefined1  [8])
        p.scripts.super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl.
        super__Vector_impl_data._M_start) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x28);
      *puVar5 = 0;
      puVar5[1] = 0;
      puVar5[2] = 0;
      puVar5[3] = 0;
      puVar5[4] = 0;
      puVar5[1] = puVar5 + 3;
      puVar5[2] = 0;
      *(undefined1 *)(puVar5 + 3) = 0;
      *puVar5 = &PTR__NativeException_00245af0;
      __cxa_throw(puVar5,&PackageNotFoundException::typeinfo,NativeException::~NativeException);
    }
    package._M_t.super___uniq_ptr_impl<chatra::Package,_std::default_delete<chatra::Package>_>._M_t.
    super__Tuple_impl<0UL,_chatra::Package_*,_std::default_delete<chatra::Package>_>.
    super__Head_base<0UL,_chatra::Package_*,_false>._M_head_impl._0_1_ = 1;
    IdPool<chatra::PackageId,chatra::Package>::
    lockAndAllocate<chatra::RuntimeImp&,std::__cxx11::string_const&,chatra::PackageInfo,bool>
              ((IdPool<chatra::PackageId,chatra::Package> *)
               &p.interface.super___shared_ptr<chatra::IPackage,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(RuntimeImp *)&this->packageIds,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
               (PackageInfo *)packageName,(bool *)local_80);
    package._M_t.super___uniq_ptr_impl<chatra::Package,_std::default_delete<chatra::Package>_>._M_t.
    super__Tuple_impl<0UL,_chatra::Package_*,_std::default_delete<chatra::Package>_>.
    super__Head_base<0UL,_chatra::Package_*,_false>._M_head_impl =
         (__uniq_ptr_data<chatra::Package,_std::default_delete<chatra::Package>,_true,_true>)
         p.interface.super___shared_ptr<chatra::IPackage,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi[5]._vptr__Sp_counted_base;
    do {
      LOCK();
      _Var1 = (this->lockPackages).flag.super___atomic_flag_base._M_i;
      (this->lockPackages).flag.super___atomic_flag_base._M_i = true;
      UNLOCK();
    } while (_Var1 != false);
    std::
    _Hashtable<chatra::PackageId,std::pair<chatra::PackageId_const,std::unique_ptr<chatra::Package,std::default_delete<chatra::Package>>>,std::allocator<std::pair<chatra::PackageId_const,std::unique_ptr<chatra::Package,std::default_delete<chatra::Package>>>>,std::__detail::_Select1st,std::equal_to<chatra::PackageId>,std::hash<chatra::PackageId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<chatra::PackageId&,std::unique_ptr<chatra::Package,std::default_delete<chatra::Package>>>
              ((_Hashtable<chatra::PackageId,std::pair<chatra::PackageId_const,std::unique_ptr<chatra::Package,std::default_delete<chatra::Package>>>,std::allocator<std::pair<chatra::PackageId_const,std::unique_ptr<chatra::Package,std::default_delete<chatra::Package>>>>,std::__detail::_Select1st,std::equal_to<chatra::PackageId>,std::hash<chatra::PackageId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->packages,&package,
               &p.interface.super___shared_ptr<chatra::IPackage,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,chatra::PackageId>,std::allocator<std::pair<std::__cxx11::string_const,chatra::PackageId>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::__cxx11::string_const&,chatra::PackageId&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,chatra::PackageId>,std::allocator<std::pair<std::__cxx11::string_const,chatra::PackageId>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&this->packageIdByName,packageName,&package);
    unaff_R13._M_head_impl = (Package *)package;
    (this->lockPackages).flag.super___atomic_flag_base._M_i = false;
    if (p.interface.super___shared_ptr<chatra::IPackage,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      Package::~Package((Package *)
                        p.interface.super___shared_ptr<chatra::IPackage,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi);
      operator_delete(p.interface.super___shared_ptr<chatra::IPackage,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi);
    }
    if (p.interface.super___shared_ptr<chatra::IPackage,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 p.interface.super___shared_ptr<chatra::IPackage,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                );
    }
    std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::
    ~vector((vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_> *
            )&p.scripts.super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
    std::vector<chatra::Script,_std::allocator<chatra::Script>_>::~vector
              ((vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_80);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtLoadPackage);
  return (PackageId)
         (tuple<chatra::Package_*,_std::default_delete<chatra::Package>_>)unaff_R13._M_head_impl;
}

Assistant:

PackageId RuntimeImp::loadPackage(const std::string& packageName) {
	std::lock_guard<std::mutex> lock0(mtLoadPackage);
	{
		std::lock_guard<SpinLock> lock1(lockPackages);
		auto it = packageIdByName.find(packageName);
		if (it != packageIdByName.end())
			return it->second;
	}
	auto p = host->queryPackage(packageName);
	if (p.scripts.empty())
		throw PackageNotFoundException();

	auto package = packageIds.lockAndAllocate(*this, packageName, std::move(p), true);
	auto packageId = package->getId();

	std::lock_guard<SpinLock> lock(lockPackages);
	packages.emplace(packageId, std::move(package));
	packageIdByName.emplace(packageName, packageId);
	return packageId;
}